

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::createDecl
          (ModuleDeclaration *__return_storage_ptr__,SourceCodeOperations *this,ModuleBase *m)

{
  CodeLocation *this_00;
  UTF8Reader *this_01;
  bool bVar1;
  undefined1 local_a0 [72];
  char *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  CodeLocation local_40;
  CodeLocation local_30;
  
  __return_storage_ptr__->module = m;
  __return_storage_ptr__->allocator = &this->allocator;
  this_00 = &__return_storage_ptr__->moduleKeyword;
  (__return_storage_ptr__->startIncludingPreamble).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->startIncludingPreamble).location.data = (char *)0x0;
  (__return_storage_ptr__->moduleKeyword).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->moduleKeyword).location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).valid = false;
  (__return_storage_ptr__->fileComment).isStarSlash = false;
  (__return_storage_ptr__->fileComment).isDoxygenStyle = false;
  (__return_storage_ptr__->fileComment).isReferringBackwards = false;
  (__return_storage_ptr__->openBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->openBrace).location.data = (char *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->fileComment).range.start.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.start.location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).range.end.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.end.location.data = (char *)0x0;
  CodeLocation::operator=(this_00,&m->processorKeywordLocation);
  ModuleDeclaration::getType_abi_cxx11_((string *)local_a0,__return_storage_ptr__);
  this_01 = &(__return_storage_ptr__->moduleKeyword).location;
  bVar1 = UTF8Reader::startsWith(this_01,(char *)local_a0._0_8_);
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_a0);
    local_30.sourceCode.object = (this_00->sourceCode).object;
    if (local_30.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_30.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_30.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_30.location.data = this_01->data;
    SourceCodeUtilities::findStartOfPrecedingComment((SourceCodeUtilities *)local_a0,&local_30);
    CodeLocation::operator=
              (&__return_storage_ptr__->startIncludingPreamble,(CodeLocation *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_30.sourceCode);
    local_40.sourceCode.object = (this_00->sourceCode).object;
    if (local_40.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_40.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_40.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_40.location.data = this_01->data;
    SimpleTokeniser::findNext((SimpleTokeniser *)local_a0,&local_40,(TokenType)0x2a351b);
    CodeLocation::operator=(&__return_storage_ptr__->openBrace,(CodeLocation *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_40.sourceCode);
    local_50._M_allocated_capacity =
         (size_type)(__return_storage_ptr__->openBrace).sourceCode.object;
    if ((SourceCodeText *)local_50._M_allocated_capacity != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_50._M_allocated_capacity)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_50._M_allocated_capacity)->super_RefCountedObject).refCount + 1
      ;
    }
    local_50._8_8_ = (__return_storage_ptr__->openBrace).location.data;
    SourceCodeUtilities::findEndOfMatchingBrace
              ((SourceCodeUtilities *)local_a0,(CodeLocation *)&local_50);
    CodeLocation::operator=(&__return_storage_ptr__->endOfClosingBrace,(CodeLocation *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_50._M_allocated_capacity);
    local_a0._64_8_ = (__return_storage_ptr__->startIncludingPreamble).sourceCode.object;
    if ((SourceCodeText *)local_a0._64_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_a0._64_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_a0._64_8_)->super_RefCountedObject).refCount + 1;
    }
    local_58 = (__return_storage_ptr__->startIncludingPreamble).location.data;
    SourceCodeUtilities::parseComment((Comment *)local_a0,(CodeLocation *)(local_a0 + 0x40));
    SourceCodeUtilities::Comment::operator=
              (&__return_storage_ptr__->fileComment,(Comment *)local_a0);
    SourceCodeUtilities::Comment::~Comment((Comment *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)(local_a0 + 0x40));
    return __return_storage_ptr__;
  }
  throwInternalCompilerError
            ("d.moduleKeyword.location.startsWith (d.getType().c_str())","createDecl",0x72);
}

Assistant:

SourceCodeOperations::ModuleDeclaration SourceCodeOperations::createDecl (AST::ModuleBase& m)
{
    ModuleDeclaration d { m, allocator };

    d.moduleKeyword = m.processorKeywordLocation;
    SOUL_ASSERT (d.moduleKeyword.location.startsWith (d.getType().c_str()));

    d.startIncludingPreamble = SourceCodeUtilities::findStartOfPrecedingComment (d.moduleKeyword);
    d.openBrace = SimpleTokeniser::findNext (d.moduleKeyword, Operator::openBrace);
    d.endOfClosingBrace = SourceCodeUtilities::findEndOfMatchingBrace (d.openBrace);
    d.fileComment = SourceCodeUtilities::parseComment (d.startIncludingPreamble);
    return d;
}